

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

decimal_fp<double> fmt::v11::detail::dragonbox::to_decimal<double>(double x)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  compute_mul_parity_result cVar4;
  byte bVar5;
  int iVar6;
  char cVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  compute_mul_result cVar16;
  uint128_fallback uVar17;
  decimal_fp<double> dVar18;
  cache_entry_type cache;
  
  uVar14 = (ulong)x & 0xfffffffffffff;
  uVar10 = (uint)((ulong)x >> 0x34) & 0x7ff;
  if (uVar10 == 0) {
    uVar10 = 0xfffffbce;
    if (uVar14 == 0) {
      iVar6 = 0;
      uVar12 = 0;
      goto LAB_004000e2;
    }
LAB_003ffdba:
    iVar6 = (int)(uVar10 * 0x4d105) >> 0x14;
    cache = cache_accessor<double>::get_cached_power(2 - iVar6);
    uVar9 = cache.hi_;
    iVar8 = ((2 - iVar6) * 0x1a934f >> 0x13) + uVar10;
    cVar16 = cache_accessor<double>::compute_mul(uVar14 * 2 + 1 << ((byte)iVar8 & 0x3f),&cache);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = cVar16.result;
    uVar12 = SUB168(auVar1 * ZEXT816(0x20c49ba5e353f7cf),8) >> 7;
    uVar11 = (int)cVar16.result + (int)uVar12 * -1000;
    uVar10 = (uint)(uVar9 >> (~(byte)iVar8 & 0x3f));
    if (uVar11 < uVar10) {
      if ((uVar11 != 0) || (((uint)(cVar16.is_integer & 1) & (uint)uVar14) == 0)) {
LAB_003ffe7f:
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar12;
        iVar6 = iVar6 + 1;
        if (SUB168(auVar2 * ZEXT816(0xabcc77118461cefd),0) < 0xabcc77118461cefd &&
            (auVar2 * ZEXT816(0xabcc77118461cefd) & (undefined1  [16])0x3ffffff) ==
            (undefined1  [16])0x0) {
          uVar12 = uVar12 / 100000000;
          iVar8 = 6;
          do {
            uVar10 = (uint)uVar12;
            uVar11 = uVar10 * 0x40000000 | uVar10 * -0x3d70a3d7 >> 2;
            uVar12 = (ulong)uVar11;
            iVar8 = iVar8 + 2;
          } while (uVar11 < 0x28f5c29);
          goto LAB_00400069;
        }
        iVar8 = -2;
        do {
          uVar14 = uVar12;
          uVar12 = uVar14 * -0x70a3d70a3d70a3d7 >> 2 | uVar14 << 0x3e;
          iVar8 = iVar8 + 2;
        } while (uVar12 < 0x28f5c28f5c28f5d);
        uVar12 = uVar14 * -0x3333333333333333 >> 1 | uVar14 << 0x3f;
        bVar15 = uVar12 < 0x199999999999999a;
        if (!bVar15) {
          uVar12 = uVar14;
        }
        goto LAB_004000dd;
      }
      uVar12 = uVar12 - 1;
      uVar11 = 1000;
    }
    else if ((uVar11 <= uVar10) &&
            (cVar4 = cache_accessor<double>::compute_mul_parity(uVar14 * 2 - 1,&cache,iVar8),
            (~(uint)uVar14 & (uint)((ushort)cVar4 >> 8) & 1) != 0 || ((ushort)cVar4 & 1) != 0))
    goto LAB_003ffe7f;
    uVar11 = uVar11 - (uVar10 >> 1);
    uVar10 = uVar11 * 0x290 + 0x8020;
    uVar13 = uVar10 >> 0x10;
    uVar12 = (ulong)uVar13 + uVar12 * 10;
    if ((uVar10 & 0xffff) < 0x290) {
      cVar4 = cache_accessor<double>::compute_mul_parity(uVar14 * 2,&cache,iVar8);
      if ((uVar11 & 1) == ((ushort)cVar4 & 1)) {
        uVar12 = uVar12 + (long)(int)-(uVar13 & (ushort)cVar4 >> 8 & 1);
      }
      else {
        uVar12 = uVar12 - 1;
      }
    }
  }
  else {
    uVar10 = uVar10 - 0x433;
    if (uVar14 != 0) {
      uVar14 = uVar14 + 0x10000000000000;
      goto LAB_003ffdba;
    }
    iVar6 = (int)(uVar10 * 0x9a209 + -0x3fe1f) >> 0x15;
    cVar7 = (char)(iVar6 * -0x1a934f >> 0x13) + (char)uVar10;
    uVar17 = cache_accessor<double>::get_cached_power(-iVar6);
    uVar12 = uVar17.hi_;
    bVar5 = 0xb - cVar7;
    uVar9 = (ulong)((uVar10 & 0xfffffffe) != 2) + (uVar12 - (uVar12 >> 0x36) >> (bVar5 & 0x3f));
    uVar14 = ((uVar12 >> 0x35) + uVar12 >> (bVar5 & 0x3f)) / 10;
    if (uVar14 * 10 < uVar9) {
      uVar12 = (uVar12 >> (10U - cVar7 & 0x3f)) + 1 >> 1;
      if (uVar10 == 0xffffffb3) {
        uVar12 = uVar12 & 0xfffffffffffffffe;
      }
      else {
        uVar12 = uVar12 + (uVar12 < uVar9);
      }
      goto LAB_004000e2;
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar14;
    iVar6 = iVar6 + 1;
    if (SUB168(auVar3 * ZEXT816(0xabcc77118461cefd),0) < 0xabcc77118461cefd &&
        (auVar3 * ZEXT816(0xabcc77118461cefd) & (undefined1  [16])0x3ffffff) ==
        (undefined1  [16])0x0) {
      uVar14 = uVar14 / 100000000;
      iVar8 = 6;
      do {
        uVar10 = (uint)uVar14;
        uVar11 = uVar10 * 0x40000000 | uVar10 * -0x3d70a3d7 >> 2;
        uVar14 = (ulong)uVar11;
        iVar8 = iVar8 + 2;
      } while (uVar11 < 0x28f5c29);
LAB_00400069:
      uVar11 = uVar10 * -0x33333333 >> 1 | (uint)((uVar10 * -0x33333333 & 1) != 0) << 0x1f;
      bVar15 = uVar11 < 0x1999999a;
      if (!bVar15) {
        uVar11 = uVar10;
      }
      uVar12 = (ulong)uVar11;
    }
    else {
      iVar8 = -2;
      do {
        uVar9 = uVar14;
        uVar14 = uVar9 * -0x70a3d70a3d70a3d7 >> 2 | uVar9 << 0x3e;
        iVar8 = iVar8 + 2;
      } while (uVar14 < 0x28f5c28f5c28f5d);
      uVar12 = uVar9 * -0x3333333333333333 >> 1 | uVar9 << 0x3f;
      bVar15 = uVar12 < 0x199999999999999a;
      if (!bVar15) {
        uVar12 = uVar9;
      }
    }
LAB_004000dd:
    iVar6 = iVar6 + iVar8 + (uint)bVar15;
  }
LAB_004000e2:
  dVar18.exponent = iVar6;
  dVar18.significand = uVar12;
  dVar18._12_4_ = 0;
  return dVar18;
}

Assistant:

auto to_decimal(T x) noexcept -> decimal_fp<T> {
  // Step 1: integer promotion & Schubfach multiplier calculation.

  using carrier_uint = typename float_info<T>::carrier_uint;
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  auto br = bit_cast<carrier_uint>(x);

  // Extract significand bits and exponent bits.
  const carrier_uint significand_mask =
      (static_cast<carrier_uint>(1) << num_significand_bits<T>()) - 1;
  carrier_uint significand = (br & significand_mask);
  int exponent =
      static_cast<int>((br & exponent_mask<T>()) >> num_significand_bits<T>());

  if (exponent != 0) {  // Check if normal.
    exponent -= exponent_bias<T>() + num_significand_bits<T>();

    // Shorter interval case; proceed like Schubfach.
    // In fact, when exponent == 1 and significand == 0, the interval is
    // regular. However, it can be shown that the end-results are anyway same.
    if (significand == 0) return shorter_interval_case<T>(exponent);

    significand |= (static_cast<carrier_uint>(1) << num_significand_bits<T>());
  } else {
    // Subnormal case; the interval is always regular.
    if (significand == 0) return {0, 0};
    exponent =
        std::numeric_limits<T>::min_exponent - num_significand_bits<T>() - 1;
  }

  const bool include_left_endpoint = (significand % 2 == 0);
  const bool include_right_endpoint = include_left_endpoint;

  // Compute k and beta.
  const int minus_k = floor_log10_pow2(exponent) - float_info<T>::kappa;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);
  const int beta = exponent + floor_log2_pow10(-minus_k);

  // Compute zi and deltai.
  // 10^kappa <= deltai < 10^(kappa + 1)
  const uint32_t deltai = cache_accessor<T>::compute_delta(cache, beta);
  const carrier_uint two_fc = significand << 1;

  // For the case of binary32, the result of integer check is not correct for
  // 29711844 * 2^-82
  // = 6.1442653300000000008655037797566933477355632930994033813476... * 10^-18
  // and 29711844 * 2^-81
  // = 1.2288530660000000001731007559513386695471126586198806762695... * 10^-17,
  // and they are the unique counterexamples. However, since 29711844 is even,
  // this does not cause any problem for the endpoints calculations; it can only
  // cause a problem when we need to perform integer check for the center.
  // Fortunately, with these inputs, that branch is never executed, so we are
  // fine.
  const typename cache_accessor<T>::compute_mul_result z_mul =
      cache_accessor<T>::compute_mul((two_fc | 1) << beta, cache);

  // Step 2: Try larger divisor; remove trailing zeros if necessary.

  // Using an upper bound on zi, we might be able to optimize the division
  // better than the compiler; we are computing zi / big_divisor here.
  decimal_fp<T> ret_value;
  ret_value.significand = divide_by_10_to_kappa_plus_1(z_mul.result);
  uint32_t r = static_cast<uint32_t>(z_mul.result - float_info<T>::big_divisor *
                                                        ret_value.significand);

  if (r < deltai) {
    // Exclude the right endpoint if necessary.
    if (r == 0 && (z_mul.is_integer & !include_right_endpoint)) {
      --ret_value.significand;
      r = float_info<T>::big_divisor;
      goto small_divisor_case_label;
    }
  } else if (r > deltai) {
    goto small_divisor_case_label;
  } else {
    // r == deltai; compare fractional parts.
    const typename cache_accessor<T>::compute_mul_parity_result x_mul =
        cache_accessor<T>::compute_mul_parity(two_fc - 1, cache, beta);

    if (!(x_mul.parity | (x_mul.is_integer & include_left_endpoint)))
      goto small_divisor_case_label;
  }
  ret_value.exponent = minus_k + float_info<T>::kappa + 1;

  // We may need to remove trailing zeros.
  ret_value.exponent += remove_trailing_zeros(ret_value.significand);
  return ret_value;

  // Step 3: Find the significand with the smaller divisor.

small_divisor_case_label:
  ret_value.significand *= 10;
  ret_value.exponent = minus_k + float_info<T>::kappa;

  uint32_t dist = r - (deltai / 2) + (float_info<T>::small_divisor / 2);
  const bool approx_y_parity =
      ((dist ^ (float_info<T>::small_divisor / 2)) & 1) != 0;

  // Is dist divisible by 10^kappa?
  const bool divisible_by_small_divisor =
      check_divisibility_and_divide_by_pow10<float_info<T>::kappa>(dist);

  // Add dist / 10^kappa to the significand.
  ret_value.significand += dist;

  if (!divisible_by_small_divisor) return ret_value;

  // Check z^(f) >= epsilon^(f).
  // We have either yi == zi - epsiloni or yi == (zi - epsiloni) - 1,
  // where yi == zi - epsiloni if and only if z^(f) >= epsilon^(f).
  // Since there are only 2 possibilities, we only need to care about the
  // parity. Also, zi and r should have the same parity since the divisor
  // is an even number.
  const auto y_mul = cache_accessor<T>::compute_mul_parity(two_fc, cache, beta);

  // If z^(f) >= epsilon^(f), we might have a tie when z^(f) == epsilon^(f),
  // or equivalently, when y is an integer.
  if (y_mul.parity != approx_y_parity)
    --ret_value.significand;
  else if (y_mul.is_integer & (ret_value.significand % 2 != 0))
    --ret_value.significand;
  return ret_value;
}